

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::shift_right(char *ext,uint shift)

{
  uint dig_00;
  uint in_ESI;
  char *in_RDI;
  uint dig;
  size_t i;
  size_t prec;
  ulong local_20;
  
  local_20 = get_prec((char *)0x313ee7);
  if ((in_ESI & 1) == 0) {
    for (local_20 = local_20 + 1 >> 1; in_ESI >> 1 < local_20; local_20 = local_20 - 1) {
      in_RDI[local_20 + 4] = in_RDI[(local_20 + 4) - (ulong)(in_ESI >> 1)];
    }
    for (; local_20 != 0; local_20 = local_20 - 1) {
      in_RDI[local_20 + 4] = '\0';
    }
  }
  else {
    for (; in_ESI < local_20; local_20 = local_20 - 1) {
      dig_00 = get_dig(in_RDI,(local_20 - 1) - (ulong)in_ESI);
      set_dig(in_RDI,local_20 - 1,dig_00);
    }
    for (; local_20 != 0; local_20 = local_20 - 1) {
      set_dig(in_RDI,local_20 - 1,0);
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::shift_right(char *ext, unsigned int shift)
{
    size_t prec = get_prec(ext);
    size_t i;

    /* if it's an even shift, it's especially easy */
    if ((shift & 1) == 0)
    {
        /* simply move the bytes left by the required amount */
        for (i = (prec+1)/2 ; i > shift/2 ; --i)
            ext[VMBN_MANT + i-1] = ext[VMBN_MANT + i-1 - shift/2];

        /* zero the leading digits */
        for ( ; i > 0 ; --i)
            ext[VMBN_MANT + i-1] = 0;
    }
    else
    {
        /* apply the shift to each digit */
        for (i = prec ; i > shift  ; --i)
        {
            unsigned int dig;

            /* get this source digit */
            dig = get_dig(ext, i-1 - shift);

            /* set this destination digit */
            set_dig(ext, i-1, dig);
        }

        /* zero the remaining digits */
        for ( ; i >0 ; --i)
            set_dig(ext, i-1, 0);
    }
}